

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O1

bool JsUtil::NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode_*>::Equals
               (CaseInvariantPropertyListWithHashCode *list1,
               CaseInvariantPropertyListWithHashCode *list2)

{
  uint uVar1;
  Type pcVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  RecyclerWeakReference<const_Js::PropertyRecord> *pRVar6;
  undefined1 local_38 [8];
  CharacterBuffer<char16_t> string;
  
  if (list1 == (CaseInvariantPropertyListWithHashCode *)0x0 ||
      list2 == (CaseInvariantPropertyListWithHashCode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                       ,0xcc,"(list1 != nullptr && list2 != nullptr)",
                       "list1 != nullptr && list2 != nullptr");
    if (!bVar4) goto LAB_0078e36e;
    *puVar5 = 0;
  }
  if (list1 == list2) {
    bVar4 = true;
  }
  else {
    if ((*(int *)&(list1->
                  super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ).field_0x2c ==
         *(int *)&(list2->
                  super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ).field_0x2c) &&
       (pRVar6 = List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::CompactEnd<true>(&list2->
                                     super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                   ),
       pRVar6 != (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0)) {
      pcVar2 = (pRVar6->super_RecyclerWeakReferenceBase).strongRef;
      if (pcVar2 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                           ,0xe3,"(prop)","prop");
        if (!bVar4) {
LAB_0078e36e:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      uVar1 = *(uint *)(pcVar2 + 0x14);
      Memory::Recycler::WBSetBit((char *)local_38);
      local_38 = (undefined1  [8])(pcVar2 + 0x18);
      Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer<char16_t> *)local_38);
      string.string.ptr._0_4_ = uVar1 >> 1;
      bVar4 = Equals(list1,(CharacterBuffer<char16_t> *)local_38);
      return bVar4;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode*>::Equals(_In_ Js::CaseInvariantPropertyListWithHashCode* list1, _In_ Js::CaseInvariantPropertyListWithHashCode* list2)
    {
        Assert(list1 != nullptr && list2 != nullptr);

        // If the two lists are the same, they're equal
        if (list1 == list2)
        {
            return true;
        }

        // If they don't have the same case invariant hash code, they're not equal
        if (list1->caseInvariantHashCode != list2->caseInvariantHashCode)
        {
            return false;
        }

        // Find a string from list 2
        // If it's the same when compared with a string from list 1 in a case insensitive way, they're equal
        const RecyclerWeakReference<Js::PropertyRecord const>* propRecordWeakRef = list2->CompactEnd<true>();

        if (propRecordWeakRef != nullptr)
        {
            const Js::PropertyRecord* prop = propRecordWeakRef->Get();

            // Since compaction returned this pointer, their strong refs should not be null
            Assert(prop);

            JsUtil::CharacterBuffer<WCHAR> string(prop->GetBuffer(), prop->GetLength());

            return NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode*>::Equals(list1, string);
        }

        return false;
    }